

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

void __thiscall sptk::reaper::EpochTracker::SetParameters(EpochTracker *this)

{
  this->do_highpass_ = true;
  this->do_hilbert_transform_ = false;
  this->external_frame_interval_ = 0.005;
  this->unvoiced_pulse_interval_ = 0.01;
  this->min_f0_search_ = 40.0;
  this->max_f0_search_ = 500.0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->debug_name_,0,(char *)(this->debug_name_)._M_string_length,0x12bfe8);
  this->internal_frame_interval_ = 0.002;
  this->corner_frequency_ = 80.0;
  this->filter_duration_ = 0.05;
  this->frame_duration_ = 0.02;
  this->lpc_frame_interval_ = 0.01;
  this->preemphasis_ = 0.98;
  this->noise_floor_ = 70.0;
  this->peak_delay_ = 0.0004;
  this->skew_delay_ = 0.00015;
  this->peak_val_wt_ = 0.1;
  this->peak_prominence_wt_ = 0.3;
  this->peak_skew_wt_ = 0.1;
  this->peak_quality_floor_ = 0.01;
  this->time_span_ = 0.02;
  this->level_change_den_ = 30.0;
  this->min_rms_db_ = 20.0;
  this->ref_dur_ = 0.02;
  this->min_freq_for_rms_ = 100.0;
  this->max_freq_for_rms_ = 1000.0;
  this->rms_window_dur_ = 0.025;
  this->correlation_dur_ = 0.0075;
  this->correlation_thresh_ = 0.2;
  this->reward_ = -1.5;
  this->period_deviation_wt_ = 1.0;
  this->peak_quality_wt_ = 1.3;
  this->unvoiced_cost_ = 0.9;
  this->nccf_uv_peak_wt_ = 0.9;
  this->period_wt_ = 0.0002;
  this->level_wt_ = 0.8;
  this->freq_trans_wt_ = 1.8;
  this->voice_transition_factor_ = 1.4;
  this->endpoint_padding_ = 0.01;
  return;
}

Assistant:

void EpochTracker::SetParameters(void) {
  // Externally-settable control parameters:
  // Period for the returned F0 signal.
  external_frame_interval_ = kExternalFrameInterval;
  do_highpass_ = kDoHighpass;  // Enables highpassing of input signal.
  // Enables Hilbert transformation of the input data.
  do_hilbert_transform_ = kDoHilbertTransform;
  max_f0_search_ = kMaxF0Search;  // Maximum F0 to search for.
  min_f0_search_ = kMinF0Search;  // Minimum F0 to search for.
  // Pulse spacing to use in unvoiced regions of the returned epoch signal.
  unvoiced_pulse_interval_ = kUnvoicedPulseInterval;
  debug_name_ = kDebugName;  // base path for all debugging signals.

  // Internal feature-computation parameters:
  // For internal feature computations
  internal_frame_interval_ = kInternalFrameInterval;
  // for the high-pass filter
  corner_frequency_ = 80.0;
  filter_duration_ = 0.05;
  // for the LPC inverse filter.
  frame_duration_ = 0.02;  // window size (sec)
  lpc_frame_interval_ = 0.01;  // (sec)
  preemphasis_ = 0.98;  // preemphasis for LPC analysis
  noise_floor_ = 70.0;  // SNR in dB simulated during LPC analysis.
  // for computing LPC residual peak quality.
  peak_delay_ = 0.0004;  // for measuring prominence
  skew_delay_ = 0.00015;  // for measuring shape
  peak_val_wt_ = 0.1;
  peak_prominence_wt_ = 0.3;
  peak_skew_wt_ = 0.1;
  peak_quality_floor_ = 0.01;
  // for computing voice-transition pseudo-probabilities
  time_span_ = 0.020;  // the interval (sec) centered on the
  // measurement point, used to compute parameter
  // deltas.
  level_change_den_ = 30.0;  // max. dB level change expected over
  // time_span_ for bandpassed RMS for
  // computing pseudo-probability of
  // voicing.
  min_rms_db_ = 20.0;  // level floor in dB
  // window size for computing amplitude-normalizing RMS
  ref_dur_ = 0.02;
  // low and high frequency limits for bandpassed RMS used in voicing indicator
  min_freq_for_rms_ = 100.0;
  max_freq_for_rms_ = 1000.0;
  // duration of integrator for bandpassed RMS
  rms_window_dur_ = 0.025;
  // window duration, in seconds, for NCCF computations
  correlation_dur_ = 0.0075;
  // ignore any NCCF peaks less than this
  correlation_thresh_ = 0.2;

  // Parametrs used by the dynamic-programming tracker:
  // reward for inserting another period
  reward_ = -1.5;
  // weight given to deviation of inter-pulse interval from the
  // closest NCCF peak lag
  period_deviation_wt_ = 1.0;
  // weight given to the quality of the residual peak
  peak_quality_wt_ = 1.3;
  // cost of the unvoiced hypothesis
  unvoiced_cost_ = kUnvoicedCost;
  // cost of high NCCF values in hypothetical unvoiced regions
  nccf_uv_peak_wt_ = 0.9;
  // weight given to period length
  period_wt_ = 0.0002;
  // weight given to the pseudo-probability of voicing feature
  level_wt_ = 0.8;
  // weight given to period-length differences between adjacent periods.
  freq_trans_wt_ = 1.8;
  // cost of switching between voicing states; modulated by voicing
  // onset/offset probs.
  voice_transition_factor_ = 1.4;

  // Parameters used to generate final outputs:
  // pad time in seconds to add to the last measured period during
  // output of periodically-resampled data
  endpoint_padding_ = 0.01;
}